

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommentReliablePdu.cpp
# Opt level: O1

bool __thiscall
DIS::CommentReliablePdu::operator==(CommentReliablePdu *this,CommentReliablePdu *rhs)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  pointer pFVar4;
  pointer pVVar5;
  long lVar6;
  
  bVar1 = SimulationManagementWithReliabilityFamilyPdu::operator==
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu,
                     &rhs->super_SimulationManagementWithReliabilityFamilyPdu);
  pFVar4 = (this->_fixedDatumRecords).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatumRecords).
      super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar4) {
    lVar6 = 0;
    uVar3 = 0;
    do {
      bVar2 = FixedDatum::operator==
                        ((FixedDatum *)((long)&pFVar4->_vptr_FixedDatum + lVar6),
                         (FixedDatum *)
                         ((long)&((rhs->_fixedDatumRecords).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum +
                         lVar6));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar3 = uVar3 + 1;
      pFVar4 = (this->_fixedDatumRecords).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
    } while (uVar3 < (ulong)((long)(this->_fixedDatumRecords).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 4));
  }
  pVVar5 = (this->_variableDatumRecords).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatumRecords).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar5) {
    lVar6 = 0;
    uVar3 = 0;
    do {
      bVar2 = VariableDatum::operator==
                        ((VariableDatum *)((long)&pVVar5->_vptr_VariableDatum + lVar6),
                         (VariableDatum *)
                         ((long)&((rhs->_variableDatumRecords).
                                  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                         lVar6));
      if (!bVar2) {
        bVar1 = false;
      }
      uVar3 = uVar3 + 1;
      pVVar5 = (this->_variableDatumRecords).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x30;
    } while (uVar3 < (ulong)(((long)(this->_variableDatumRecords).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5 >> 4)
                            * -0x5555555555555555));
  }
  return bVar1;
}

Assistant:

bool CommentReliablePdu::operator ==(const CommentReliablePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementWithReliabilityFamilyPdu::operator==(rhs);


     for(size_t idx = 0; idx < _fixedDatumRecords.size(); idx++)
     {
        if( ! ( _fixedDatumRecords[idx] == rhs._fixedDatumRecords[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatumRecords.size(); idx++)
     {
        if( ! ( _variableDatumRecords[idx] == rhs._variableDatumRecords[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }